

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O1

void __thiscall Nova::Example<float,_1>::Log_Parameters(Example<float,_1> *this)

{
  ostream *poVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->output,"initial_time=",0xd);
  poVar1 = std::ostream::_M_insert<double>((double)this->initial_time);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(this->output,"frame_rate=",0xb);
  poVar1 = std::ostream::_M_insert<double>((double)this->frame_rate);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = this->output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"first_frame=",0xc);
  plVar2 = (long *)std::ostream::operator<<(poVar1,this->first_frame);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  poVar1 = this->output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"last_frame=",0xb);
  plVar2 = (long *)std::ostream::operator<<(poVar1,this->last_frame);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  poVar1 = this->output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"restart_frame=",0xe);
  plVar2 = (long *)std::ostream::operator<<(poVar1,this->restart_frame);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  poVar1 = this->output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"write_substeps_level=",0x15);
  plVar2 = (long *)std::ostream::operator<<(poVar1,this->write_substeps_level);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  poVar1 = this->output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"frame_title=",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->frame_title)._M_dataplus._M_p,
                      (this->frame_title)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = this->output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"output_directory=",0x11);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->output_directory)._M_dataplus._M_p,
                      (this->output_directory)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = this->output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"write_time=",0xb);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = this->output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"restart=",8);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = this->output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"write_output_files=",0x13);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = this->output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"write_frame_title=",0x12);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Example<T,d>::
Log_Parameters() const
{
    *output<<"initial_time="<<initial_time<<std::endl;
    *output<<"frame_rate="<<frame_rate<<std::endl;
    *output<<"first_frame="<<first_frame<<std::endl;
    *output<<"last_frame="<<last_frame<<std::endl;
    *output<<"restart_frame="<<restart_frame<<std::endl;
    *output<<"write_substeps_level="<<write_substeps_level<<std::endl;
    *output<<"frame_title="<<frame_title<<std::endl;
    *output<<"output_directory="<<output_directory<<std::endl;
    *output<<"write_time="<<write_time<<std::endl;
    *output<<"restart="<<restart<<std::endl;
    *output<<"write_output_files="<<write_output_files<<std::endl;
    *output<<"write_frame_title="<<write_frame_title<<std::endl;
}